

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O1

bool __thiscall
FNodeBuilder::ShoveSegBehind(FNodeBuilder *this,DWORD set,node_t *node,DWORD seg,DWORD mate)

{
  int iVar1;
  
  SetNodeFromSeg(this,node,(this->Segs).Array + seg);
  this->HackSeg = seg;
  this->HackMate = mate;
  if ((this->Segs).Array[seg].planefront == false) {
    node->x = node->x + node->dx;
    node->y = node->y + node->dy;
    node->dx = -node->dx;
    node->dy = -node->dy;
  }
  iVar1 = Heuristic(this,node,set,false);
  return 0 < iVar1;
}

Assistant:

bool FNodeBuilder::ShoveSegBehind (DWORD set, node_t &node, DWORD seg, DWORD mate)
{
	SetNodeFromSeg (node, &Segs[seg]);
	HackSeg = seg;
	HackMate = mate;
	if (!Segs[seg].planefront)
	{
		node.x += node.dx;
		node.y += node.dy;
		node.dx = -node.dx;
		node.dy = -node.dy;
	}
	return Heuristic (node, set, false) > 0;
}